

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureShadowTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::TextureCubeShadowCase::init(TextureCubeShadowCase *this,EVP_PKEY_CTX *ctx)

{
  vector<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>_>
  *this_00;
  uint uVar1;
  deUint32 dVar2;
  long lVar3;
  int i;
  int iVar4;
  int extraout_EAX;
  long lVar5;
  TextureCube *pTVar6;
  TextureCube *this_01;
  RenderTarget *pRVar7;
  int i_1;
  long lVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  Vec4 (*paVVar12) [2];
  float fVar13;
  Vector<float,_4> res_3;
  Vector<float,_4> res_1;
  Vector<float,_4> res_2;
  Vec4 cScale;
  Vector<float,_4> res_4;
  Vec4 cBias;
  Vector<float,_4> res_6;
  TextureFormatInfo fmtInfo;
  TextureFormat texFmt;
  float local_118;
  Vec4 local_f8;
  float local_e8 [4];
  Vec4 local_d8;
  float local_c8 [4];
  Vec4 local_b8;
  TextureCube *local_a8;
  float afStack_a0 [2];
  float local_98 [4];
  undefined1 local_88 [8];
  Vec2 VStack_80;
  Vec2 VStack_78;
  float local_70;
  TextureFormat local_48;
  RGBA local_40 [4];
  
  uVar1 = this->m_size;
  if (uVar1 == 0) {
    uVar9 = 0x20;
  }
  else {
    uVar9 = 0x1f;
    if (uVar1 != 0) {
      for (; uVar1 >> uVar9 == 0; uVar9 = uVar9 - 1) {
      }
    }
    uVar9 = uVar9 ^ 0x1f;
  }
  local_48 = glu::mapGLInternalFormat(this->m_format);
  tcu::getTextureFormatInfo((TextureFormatInfo *)local_88,&local_48);
  iVar4 = 0x1f - uVar9;
  local_a8 = (TextureCube *)local_88;
  afStack_a0[0] = VStack_80.m_data[0];
  afStack_a0[1] = VStack_80.m_data[1];
  local_c8[0] = 0.0;
  local_c8[1] = 0.0;
  local_c8[2] = 0.0;
  local_c8[3] = 0.0;
  lVar5 = 0;
  do {
    local_c8[lVar5] = VStack_78.m_data[lVar5] - *(float *)(local_88 + lVar5 * 4);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  pTVar6 = (TextureCube *)operator_new(0x180);
  glu::TextureCube::TextureCube
            (pTVar6,((this->super_TestCase).m_context)->m_renderCtx,this->m_format,this->m_size);
  this->m_gradientTex = pTVar6;
  this_01 = (TextureCube *)operator_new(0x180);
  pTVar6 = this_01;
  glu::TextureCube::TextureCube
            (this_01,((this->super_TestCase).m_context)->m_renderCtx,this->m_format,this->m_size);
  this->m_gridTex = this_01;
  if (init()::gradients == '\0') {
    init((EVP_PKEY_CTX *)pTVar6);
  }
  lVar5 = 0;
  iVar10 = 0;
  if (0 < iVar4) {
    iVar10 = iVar4;
  }
  paVVar12 = init::gradients;
  do {
    if (uVar1 != 0) {
      uVar11 = 0;
      do {
        tcu::TextureCube::allocLevel(&this->m_gradientTex->m_refTexture,(CubeFace)lVar5,(int)uVar11)
        ;
        lVar3 = (long)(this->m_gradientTex->m_refTexture).m_access[lVar5].
                      super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        local_e8[0] = 0.0;
        local_e8[1] = 0.0;
        local_e8[2] = 0.0;
        local_e8[3] = 0.0;
        lVar8 = 0;
        do {
          local_e8[lVar8] = (*paVVar12)[0].m_data[lVar8] * local_c8[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        local_d8.m_data[0] = 0.0;
        local_d8.m_data[1] = 0.0;
        local_d8.m_data[2] = 0.0;
        local_d8.m_data[3] = 0.0;
        lVar8 = 0;
        do {
          local_d8.m_data[lVar8] = local_e8[lVar8] + *(float *)((long)&local_a8 + lVar8 * 4);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        local_f8.m_data[0] = 0.0;
        local_f8.m_data[1] = 0.0;
        local_f8.m_data[2] = 0.0;
        local_f8.m_data[3] = 0.0;
        lVar8 = 0;
        do {
          local_f8.m_data[lVar8] = (*paVVar12)[1].m_data[lVar8] * local_c8[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        local_b8.m_data[0] = 0.0;
        local_b8.m_data[1] = 0.0;
        local_b8.m_data[2] = 0.0;
        local_b8.m_data[3] = 0.0;
        lVar8 = 0;
        do {
          local_b8.m_data[lVar8] = local_f8.m_data[lVar8] + *(float *)((long)&local_a8 + lVar8 * 4);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        tcu::fillWithComponentGradients
                  ((PixelBufferAccess *)(lVar3 + uVar11 * 0x28),&local_d8,&local_b8);
        uVar11 = uVar11 + 1;
      } while (uVar11 != iVar10 + 1);
    }
    lVar5 = lVar5 + 1;
    paVVar12 = paVVar12 + 1;
  } while (lVar5 != 6);
  lVar5 = 0;
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  do {
    if (uVar1 != 0) {
      uVar11 = 0;
      do {
        tcu::TextureCube::allocLevel(&this->m_gridTex->m_refTexture,(CubeFace)lVar5,(int)uVar11);
        lVar3 = (long)(this->m_gridTex->m_refTexture).m_access[lVar5].
                      super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        tcu::RGBA::toVec((RGBA *)&local_b8);
        local_e8[0] = 0.0;
        local_e8[1] = 0.0;
        local_e8[2] = 0.0;
        local_e8[3] = 0.0;
        lVar8 = 0;
        do {
          local_e8[lVar8] = local_b8.m_data[lVar8] * local_c8[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        local_d8.m_data[0] = 0.0;
        local_d8.m_data[1] = 0.0;
        local_d8.m_data[2] = 0.0;
        local_d8.m_data[3] = 0.0;
        lVar8 = 0;
        do {
          local_d8.m_data[lVar8] = local_e8[lVar8] + *(float *)((long)&local_a8 + lVar8 * 4);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        tcu::RGBA::toVec(local_40);
        local_98[0] = 0.0;
        local_98[1] = 0.0;
        local_98[2] = 0.0;
        local_98[3] = 0.0;
        lVar8 = 0;
        do {
          local_98[lVar8] = (float)local_40[lVar8].m_value * local_c8[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        local_f8.m_data[0] = 0.0;
        local_f8.m_data[1] = 0.0;
        local_f8.m_data[2] = 0.0;
        local_f8.m_data[3] = 0.0;
        lVar8 = 0;
        do {
          local_f8.m_data[lVar8] = local_98[lVar8] + *(float *)((long)&local_a8 + lVar8 * 4);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        tcu::fillWithGrid((PixelBufferAccess *)(uVar11 * 0x28 + lVar3),4,&local_d8,&local_f8);
        uVar11 = uVar11 + 1;
      } while (uVar11 != iVar4 + 1);
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 6);
  glu::TextureCube::upload(this->m_gradientTex);
  glu::TextureCube::upload(this->m_gridTex);
  dVar2 = this->m_compareFunc;
  if (dVar2 == 0x205 || dVar2 == 0x202) {
    fVar13 = 1.0;
  }
  else {
    fVar13 = 0.5;
  }
  local_118 = 0.0;
  if (dVar2 != 0x205 && dVar2 != 0x202) {
    local_118 = 0.5;
  }
  pRVar7 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar4 = pRVar7->m_numSamples;
  this_00 = &this->m_cases;
  if (iVar4 == 0) {
    local_88 = (undefined1  [8])this->m_gradientTex;
    VStack_80.m_data[0] = -1.25;
    VStack_80.m_data[1] = -1.2;
    VStack_78.m_data[0] = 1.2;
    VStack_78.m_data[1] = 1.25;
  }
  else {
    local_88 = (undefined1  [8])this->m_gradientTex;
    VStack_80.m_data[0] = -1.19;
    VStack_80.m_data[1] = -1.3;
    VStack_78.m_data[0] = 1.1;
    VStack_78.m_data[1] = 1.35;
  }
  local_70 = fVar13;
  std::
  vector<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>_>
  ::emplace_back<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>
            (this_00,(FilterCase *)local_88);
  local_88 = (undefined1  [8])this->m_gradientTex;
  VStack_80.m_data[0] = 0.8;
  VStack_80.m_data[1] = 0.8;
  VStack_78.m_data[0] = 1.25;
  VStack_78.m_data[1] = 1.2;
  local_70 = local_118;
  std::
  vector<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>_>
  ::emplace_back<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>
            (this_00,(FilterCase *)local_88);
  local_88 = (undefined1  [8])this->m_gridTex;
  VStack_80.m_data[0] = -1.19;
  VStack_80.m_data[1] = -1.3;
  VStack_78.m_data[0] = 1.1;
  VStack_78.m_data[1] = 1.35;
  local_70 = fVar13;
  std::
  vector<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>_>
  ::emplace_back<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>
            (this_00,(FilterCase *)local_88);
  local_88 = (undefined1  [8])this->m_gridTex;
  VStack_80.m_data[0] = -1.2;
  VStack_80.m_data[1] = -1.1;
  VStack_78.m_data[0] = -0.8;
  VStack_78.m_data[1] = -0.8;
  local_70 = local_118;
  std::
  vector<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>_>
  ::emplace_back<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>
            (this_00,(FilterCase *)local_88);
  local_88 = (undefined1  [8])this->m_gridTex;
  VStack_80.m_data[0] = -0.61;
  VStack_80.m_data[1] = -0.1;
  VStack_78.m_data[0] = 0.9;
  VStack_78.m_data[1] = 1.18;
  local_70 = 1.1;
  std::
  vector<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>_>
  ::emplace_back<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>
            (this_00,(FilterCase *)local_88);
  if (iVar4 == 0) {
    local_88 = (undefined1  [8])this->m_gridTex;
    VStack_78.m_data[0] = 0.05;
  }
  else {
    local_88 = (undefined1  [8])this->m_gridTex;
    VStack_78.m_data[0] = 0.25;
  }
  VStack_80.m_data[0] = -0.75;
  VStack_80.m_data[1] = 1.0;
  VStack_78.m_data[1] = 0.75;
  local_70 = -0.1;
  std::
  vector<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>_>
  ::emplace_back<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>
            (this_00,(FilterCase *)local_88);
  this->m_caseNdx = 0;
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return extraout_EAX;
}

Assistant:

void TextureCubeShadowCase::init (void)
{
	try
	{
		DE_ASSERT(!m_gradientTex && !m_gridTex);

		int						numLevels	= deLog2Floor32(m_size)+1;
		tcu::TextureFormat		texFmt		= glu::mapGLInternalFormat(m_format);
		tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(texFmt);
		tcu::Vec4				cBias		= fmtInfo.valueMin;
		tcu::Vec4				cScale		= fmtInfo.valueMax-fmtInfo.valueMin;

		// Create textures.
		m_gradientTex	= new glu::TextureCube(m_context.getRenderContext(), m_format, m_size);
		m_gridTex		= new glu::TextureCube(m_context.getRenderContext(), m_format, m_size);

		// Fill first with gradient texture.
		static const tcu::Vec4 gradients[tcu::CUBEFACE_LAST][2] =
		{
			{ tcu::Vec4(-1.0f, -1.0f, -1.0f, 2.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f) }, // negative x
			{ tcu::Vec4( 0.0f, -1.0f, -1.0f, 2.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f) }, // positive x
			{ tcu::Vec4(-1.0f,  0.0f, -1.0f, 2.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f) }, // negative y
			{ tcu::Vec4(-1.0f, -1.0f,  0.0f, 2.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f) }, // positive y
			{ tcu::Vec4(-1.0f, -1.0f, -1.0f, 0.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f) }, // negative z
			{ tcu::Vec4( 0.0f,  0.0f,  0.0f, 2.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f) }  // positive z
		};
		for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
		{
			for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
			{
				m_gradientTex->getRefTexture().allocLevel((tcu::CubeFace)face, levelNdx);
				tcu::fillWithComponentGradients(m_gradientTex->getRefTexture().getLevelFace(levelNdx, (tcu::CubeFace)face), gradients[face][0]*cScale + cBias, gradients[face][1]*cScale + cBias);
			}
		}

		// Fill second with grid texture.
		for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
		{
			for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
			{
				deUint32	step	= 0x00ffffff / (numLevels*tcu::CUBEFACE_LAST);
				deUint32	rgb		= step*levelNdx*face;
				deUint32	colorA	= 0xff000000 | rgb;
				deUint32	colorB	= 0xff000000 | ~rgb;

				m_gridTex->getRefTexture().allocLevel((tcu::CubeFace)face, levelNdx);
				tcu::fillWithGrid(m_gridTex->getRefTexture().getLevelFace(levelNdx, (tcu::CubeFace)face), 4, tcu::RGBA(colorA).toVec()*cScale + cBias, tcu::RGBA(colorB).toVec()*cScale + cBias);
			}
		}

		// Upload.
		m_gradientTex->upload();
		m_gridTex->upload();
	}
	catch (const std::exception&)
	{
		// Clean up to save memory.
		TextureCubeShadowCase::deinit();
		throw;
	}

	// Compute cases
	{
		const float refInRangeUpper		= (m_compareFunc == GL_EQUAL || m_compareFunc == GL_NOTEQUAL) ? 1.0f : 0.5f;
		const float refInRangeLower		= (m_compareFunc == GL_EQUAL || m_compareFunc == GL_NOTEQUAL) ? 0.0f : 0.5f;
		const float refOutOfBoundsUpper	= 1.1f;
		const float refOutOfBoundsLower	= -0.1f;
		const bool	singleSample		= m_context.getRenderTarget().getNumSamples() == 0;

		if (singleSample)
			m_cases.push_back(FilterCase(m_gradientTex,	refInRangeUpper, tcu::Vec2(-1.25f, -1.2f), tcu::Vec2(1.2f, 1.25f)));	// minification
		else
			m_cases.push_back(FilterCase(m_gradientTex,	refInRangeUpper, tcu::Vec2(-1.19f, -1.3f), tcu::Vec2(1.1f, 1.35f)));	// minification - w/ tuned coordinates to avoid hitting triangle edges

		m_cases.push_back(FilterCase(m_gradientTex,	refInRangeLower,		tcu::Vec2(0.8f, 0.8f), tcu::Vec2(1.25f, 1.20f)));	// magnification
		m_cases.push_back(FilterCase(m_gridTex,		refInRangeUpper,		tcu::Vec2(-1.19f, -1.3f), tcu::Vec2(1.1f, 1.35f)));	// minification
		m_cases.push_back(FilterCase(m_gridTex,		refInRangeLower,		tcu::Vec2(-1.2f, -1.1f), tcu::Vec2(-0.8f, -0.8f)));	// magnification
		m_cases.push_back(FilterCase(m_gridTex,		refOutOfBoundsUpper,	tcu::Vec2(-0.61f, -0.1f), tcu::Vec2(0.9f, 1.18f)));	// reference value clamp, upper

		if (singleSample)
			m_cases.push_back(FilterCase(m_gridTex,	refOutOfBoundsLower, tcu::Vec2(-0.75f, 1.0f), tcu::Vec2(0.05f, 0.75f)));	// reference value clamp, lower
		else
			m_cases.push_back(FilterCase(m_gridTex,	refOutOfBoundsLower, tcu::Vec2(-0.75f, 1.0f), tcu::Vec2(0.25f, 0.75f)));	// reference value clamp, lower
	}

	m_caseNdx = 0;
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
}